

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  xmlChar *val;
  xmlXPathObjectPtr pxVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  int code;
  ulong uVar8;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    if (nargs != 0) {
      code = 0xc;
      goto LAB_001bfe22;
    }
    val = xmlNodeGetContent(ctxt->context->node);
    if (val == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
      val = (xmlChar *)0x0;
    }
    pxVar4 = xmlXPathCacheWrapString(ctxt,val);
    xmlXPathValuePush(ctxt,pxVar4);
  }
  if (ctxt->valueNr < 1) {
    code = 0x17;
  }
  else {
    pxVar4 = ctxt->value;
    if (pxVar4 != (xmlXPathObjectPtr)0x0) {
      if (pxVar4->type == XPATH_STRING) {
LAB_001bfde4:
        pbVar5 = pxVar4->stringval;
        pbVar1 = pbVar5;
        if (pbVar5 == (byte *)0x0) {
          return;
        }
        do {
          pbVar6 = pbVar1 + 1;
          uVar8 = (ulong)*pbVar1;
          if (0x20 < uVar8) break;
          pbVar1 = pbVar6;
        } while ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0);
        bVar2 = false;
        do {
          bVar7 = (byte)uVar8;
          if (bVar7 < 0x21) {
            bVar3 = true;
            if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
              if (uVar8 == 0) {
                *pbVar5 = 0;
                return;
              }
              goto LAB_001bfe50;
            }
          }
          else {
LAB_001bfe50:
            if (bVar2) {
              *pbVar5 = 0x20;
              pbVar5 = pbVar5 + 1;
              bVar7 = pbVar6[-1];
            }
            *pbVar5 = bVar7;
            pbVar5 = pbVar5 + 1;
            bVar3 = false;
          }
          bVar2 = bVar3;
          uVar8 = (ulong)*pbVar6;
          pbVar6 = pbVar6 + 1;
        } while( true );
      }
      xmlXPathStringFunction(ctxt,1);
      pxVar4 = ctxt->value;
      if ((pxVar4 != (xmlXPathObjectPtr)0x0) && (pxVar4->type == XPATH_STRING)) goto LAB_001bfde4;
    }
    code = 0xb;
  }
LAB_001bfe22:
  xmlXPathErr(ctxt,code);
  return;
}

Assistant:

void
xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlChar *source, *target;
    int blank;

    if (ctxt == NULL) return;
    if (nargs == 0) {
        /* Use current context node */
        source = xmlXPathCastNodeToString(ctxt->context->node);
        if (source == NULL)
            xmlXPathPErrMemory(ctxt);
        xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, source));
        nargs = 1;
    }

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    source = ctxt->value->stringval;
    if (source == NULL)
        return;
    target = source;

    /* Skip leading whitespaces */
    while (IS_BLANK_CH(*source))
        source++;

    /* Collapse intermediate whitespaces, and skip trailing whitespaces */
    blank = 0;
    while (*source) {
        if (IS_BLANK_CH(*source)) {
	    blank = 1;
        } else {
            if (blank) {
                *target++ = 0x20;
                blank = 0;
            }
            *target++ = *source;
        }
        source++;
    }
    *target = 0;
}